

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-emscripten.cpp
# Opt level: O3

string * wasm::escape(string *__return_storage_ptr__,string *code)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  ulong uVar4;
  char *pcVar5;
  
  for (uVar4 = std::__cxx11::string::find((char *)code,0xe32f22,0); uVar4 != 0xffffffffffffffff;
      uVar4 = std::__cxx11::string::find((char *)code,0xe32f22,uVar4 + 3)) {
    std::__cxx11::string::replace((ulong)code,uVar4,(char *)0x2,0xe32f21);
    std::__cxx11::string::_M_assign((string *)code);
  }
  for (uVar4 = std::__cxx11::string::find((char *)code,0xe32f26,0); uVar4 != 0xffffffffffffffff;
      uVar4 = std::__cxx11::string::find((char *)code,0xe32f26,uVar4 + 3)) {
    std::__cxx11::string::replace((ulong)code,uVar4,(char *)0x2,0xe32f25);
    std::__cxx11::string::_M_assign((string *)code);
  }
  do {
    uVar4 = std::__cxx11::string::find((char)code,0x22);
    if (uVar4 == 0) {
LAB_00c802c8:
      pcVar5 = "\\\"";
    }
    else {
      if (uVar4 == 0xffffffffffffffff) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar2 = (code->_M_dataplus)._M_p;
        paVar1 = &code->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2 == paVar1) {
          uVar3 = *(undefined8 *)((long)&code->field_2 + 8);
          (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
          *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = pcVar2;
          (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
        }
        __return_storage_ptr__->_M_string_length = code->_M_string_length;
        (code->_M_dataplus)._M_p = (pointer)paVar1;
        code->_M_string_length = 0;
        (code->field_2)._M_local_buf[0] = '\0';
        return __return_storage_ptr__;
      }
      if ((code->_M_dataplus)._M_p[uVar4 - 1] != '\\') goto LAB_00c802c8;
      pcVar5 = "\\\\\"";
    }
    std::__cxx11::string::replace((ulong)code,uVar4,(char *)0x1,(ulong)pcVar5);
    std::__cxx11::string::_M_assign((string *)code);
  } while( true );
}

Assistant:

std::string escape(std::string code) {
  // replace newlines quotes with escaped newlines
  size_t curr = 0;
  while ((curr = code.find("\\n", curr)) != std::string::npos) {
    code = code.replace(curr, 2, "\\\\n");
    curr += 3; // skip this one
  }
  curr = 0;
  while ((curr = code.find("\\t", curr)) != std::string::npos) {
    code = code.replace(curr, 2, "\\\\t");
    curr += 3; // skip this one
  }
  // replace double quotes with escaped single quotes
  curr = 0;
  while ((curr = code.find('"', curr)) != std::string::npos) {
    if (curr == 0 || code[curr - 1] != '\\') {
      code = code.replace(curr,
                          1,
                          "\\"
                          "\"");
      curr += 2; // skip this one
    } else {     // already escaped, escape the slash as well
      code = code.replace(curr,
                          1,
                          "\\"
                          "\\"
                          "\"");
      curr += 3; // skip this one
    }
  }
  return code;
}